

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

bool __thiscall cmake::GetSuppressDevWarnings(cmake *this,cmMakefile *mf)

{
  cmState *this_00;
  char *val;
  allocator local_81;
  string local_80;
  char *local_60;
  char *cacheEntryValue;
  allocator local_41;
  string local_40;
  cmMakefile *local_20;
  cmMakefile *mf_local;
  cmake *this_local;
  
  local_20 = mf;
  mf_local = (cmMakefile *)this;
  if (mf == (cmMakefile *)0x0) {
    this_00 = this->State;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_81);
    val = cmState::GetCacheEntryValue(this_00,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    local_60 = val;
    this_local._7_1_ = cmSystemTools::IsOn(val);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_41);
    this_local._7_1_ = cmMakefile::IsOn(mf,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmake::GetSuppressDevWarnings(cmMakefile const* mf)
{
  /*
   * The suppression CMake variable may be set in the CMake configuration file
   * itself, so we have to check what its set to in the makefile if we can.
   */
  if (mf)
    {
    return mf->IsOn("CMAKE_SUPPRESS_DEVELOPER_WARNINGS");
    }
  else
    {
    const char* cacheEntryValue = this->State->GetCacheEntryValue(
      "CMAKE_SUPPRESS_DEVELOPER_WARNINGS");
    return cmSystemTools::IsOn(cacheEntryValue);
    }
}